

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string.c
# Opt level: O0

void test_archive_string_copy(void)

{
  archive_string v;
  archive_string u;
  archive_string t;
  archive_string s;
  archive_string *paVar1;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  uint in_stack_ffffffffffffff94;
  wchar_t in_stack_ffffffffffffff98;
  wchar_t in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  char *e1;
  char *in_stack_ffffffffffffffa8;
  char *pcVar3;
  undefined8 in_stack_ffffffffffffffb0;
  wchar_t wVar4;
  archive_string *as;
  char *in_stack_ffffffffffffffb8;
  char *file;
  void *in_stack_ffffffffffffffc0;
  void *pvVar5;
  void *extra;
  void *in_stack_ffffffffffffffd0;
  void *extra_00;
  wchar_t in_stack_ffffffffffffffd8;
  wchar_t wVar6;
  
  wVar4 = (wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  assertion_equal_int(in_stack_ffffffffffffffa8,(wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),0,
                      (char *)0x138951,in_stack_ffffffffffffffc0);
  assertion_equal_int(in_stack_ffffffffffffffa8,(wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),0,
                      (char *)0x138981,in_stack_ffffffffffffffc0);
  uVar2 = 0;
  assertion_equal_string
            (in_stack_ffffffffffffffb8,wVar4,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffd8);
  extra_00 = (void *)0x0;
  wVar6 = L'\0';
  assertion_equal_int(in_stack_ffffffffffffffa8,(wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138a0a,
                      in_stack_ffffffffffffffc0);
  assertion_equal_int(in_stack_ffffffffffffffa8,(wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138a3a,
                      in_stack_ffffffffffffffc0);
  uVar2 = 0;
  assertion_equal_string
            (in_stack_ffffffffffffffb8,wVar4,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar6);
  file = (char *)0x0;
  pvVar5 = (void *)0x0;
  assertion_equal_int(in_stack_ffffffffffffffa8,(wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138ac3,
                      (void *)0x0);
  assertion_equal_int(in_stack_ffffffffffffffa8,(wchar_t)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138af3,pvVar5);
  uVar2 = 0;
  assertion_equal_string
            (file,wVar4,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar6);
  e1 = (char *)0x0;
  pcVar3 = (char *)0x0;
  as = (archive_string *)0x0;
  assertion_equal_int((char *)0x0,L'\0',
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138b7c,pvVar5);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138bac,pvVar5);
  paVar1 = (archive_string *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar6);
  wVar4 = L'\0';
  archive_string_concat((archive_string *)CONCAT44(in_stack_ffffffffffffff94,uVar2),paVar1);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138c2e,pvVar5);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138c5e,pvVar5);
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138cca,pvVar5);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138cfd,pvVar5);
  paVar1 = (archive_string *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  pvVar5 = (void *)0x0;
  archive_string_concat((archive_string *)CONCAT44(in_stack_ffffffffffffff94,uVar2),paVar1);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138d84,pvVar5);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138db7,pvVar5);
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138e28,pvVar5);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138e5b,pvVar5);
  paVar1 = (archive_string *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  extra = (void *)0x0;
  archive_string_concat((archive_string *)CONCAT44(in_stack_ffffffffffffff94,uVar2),paVar1);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138ee2,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138f15,extra);
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138f86,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x138fb9,extra);
  pvVar5 = (void *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  archive_strncat(as,pcVar3,(size_t)e1);
  assertion_assert(e1,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),pvVar5);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x139077,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x1390aa,extra);
  paVar1 = (archive_string *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  pcVar3 = (char *)0x0;
  archive_string_concat((archive_string *)CONCAT44(in_stack_ffffffffffffff94,uVar2),paVar1);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x139134,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x139167,extra);
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x1391db,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x13920e,extra);
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x13927f,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x1392b2,extra);
  paVar1 = (archive_string *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar4);
  wVar6 = L'\0';
  archive_string_concat((archive_string *)CONCAT44(in_stack_ffffffffffffff94,uVar2),paVar1);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x13933c,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x13936f,extra);
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar6);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x1393e3,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x139416,extra);
  pvVar5 = (void *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (file,(wchar_t)((ulong)as >> 0x20),pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar6);
  archive_strncat(as,pcVar3,(size_t)e1);
  wVar4 = (wchar_t)((ulong)as >> 0x20);
  assertion_assert(e1,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                   (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),pvVar5);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x1394d4,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x139507,extra);
  paVar1 = (archive_string *)0x0;
  uVar2 = 0;
  assertion_equal_string
            (file,wVar4,pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar6);
  wVar6 = L'\0';
  archive_string_concat((archive_string *)CONCAT44(in_stack_ffffffffffffff94,uVar2),paVar1);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x139591,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x1395c4,extra);
  uVar2 = 0;
  assertion_equal_string
            (file,wVar4,pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar6);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x139638,extra);
  assertion_equal_int(pcVar3,(wchar_t)((ulong)e1 >> 0x20),
                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (char *)CONCAT44(in_stack_ffffffffffffff94,uVar2),0,(char *)0x13966b,extra);
  assertion_equal_string
            (file,wVar4,pcVar3,e1,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (char *)((ulong)in_stack_ffffffffffffff94 << 0x20),extra_00,wVar6);
  return;
}

Assistant:

static void
test_archive_string_copy(void)
{
	struct archive_string s, t, u, v;

	archive_string_init(&s);
	assertExactString(0, 0, NULL, s);
	archive_string_init(&t);
	assertExactString(0, 0, NULL, t);
	archive_string_init(&u);
	assertExactString(0, 0, NULL, u);
	archive_string_init(&v);
	assertExactString(0, 0, NULL, v);

	/* null target, null source */
	archive_string_copy(&t, &s);
	assertExactString(0, 0, NULL, s);
	assertExactString(0, EXTENT, "", t);

	/* null target, empty source */
	archive_string_copy(&u, &t);
	assertExactString(0, EXTENT, "", t);
	assertExactString(0, EXTENT, "", u);

	/* empty target, empty source */
	archive_string_copy(&u, &t);
	assertExactString(0, EXTENT, "", t);
	assertExactString(0, EXTENT, "", u);

	/* null target, non-empty source */
	assert(NULL != archive_strcpy(&s, "snafubar"));
	assertExactString(8, EXTENT, "snafubar", s);

	archive_string_copy(&v, &s);
	assertExactString(8, EXTENT, "snafubar", s);
	assertExactString(8, EXTENT, "snafubar", v);

	/* empty target, non-empty source */
	assertExactString(0, EXTENT, "", t);
	archive_string_copy(&t, &s);
	assertExactString(8, EXTENT, "snafubar", s);
	assertExactString(8, EXTENT, "snafubar", t);

	/* non-empty target, non-empty source */
	assert(NULL != archive_strcpy(&s, "fubar"));
	assertExactString(5, EXTENT, "fubar", s);

	archive_string_copy(&t, &s);
	assertExactString(5, EXTENT, "fubar", s);
	assertExactString(5, EXTENT, "fubar", t);
}